

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O3

void __thiscall gui::RadioButton::computeResize(RadioButton *this)

{
  float fVar1;
  float fVar2;
  element_type *peVar3;
  uint uVar4;
  String *string;
  float fVar5;
  FloatRect FVar6;
  
  peVar3 = (this->style_).super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  string = Button::getLabel(&this->super_Button);
  sf::Text::setString(&(peVar3->super_CheckBoxStyle).text_,string);
  FVar6 = sf::Text::getLocalBounds
                    (&(((this->style_).
                        super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->super_CheckBoxStyle).text_);
  peVar3 = (this->style_).super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  fVar1 = (peVar3->super_CheckBoxStyle).textPadding_.x;
  fVar5 = (peVar3->super_CheckBoxStyle).textPadding_.y;
  fVar2 = (peVar3->super_CheckBoxStyle).textPadding_.z;
  uVar4 = CheckBoxStyle::getCharacterSize(&peVar3->super_CheckBoxStyle);
  fVar5 = fVar5 + fVar5 + (float)uVar4 * fVar2;
  (this->super_Button).size_.y = fVar5;
  (this->super_Button).size_.x = fVar5 + fVar1 + fVar1 + FVar6.left + FVar6.width;
  return;
}

Assistant:

void RadioButton::computeResize() const {
    style_->text_.setString(getLabel());
    const auto bounds = style_->text_.getLocalBounds();
    size_ = sf::Vector2f(
        2.0f * style_->textPadding_.x + bounds.left + bounds.width,
        2.0f * style_->textPadding_.y + style_->textPadding_.z * style_->getCharacterSize()
    );
    size_.x += size_.y;
}